

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-docs.cpp
# Opt level: O3

void export_md(string *fname,llama_example ex)

{
  bool bVar1;
  common_arg *opt;
  pointer this;
  vector<common_arg_*,_std::allocator<common_arg_*>_> specific_options;
  vector<common_arg_*,_std::allocator<common_arg_*>_> sparam_options;
  vector<common_arg_*,_std::allocator<common_arg_*>_> common_options;
  common_params_context ctx_arg;
  ofstream file;
  common_params params;
  common_arg *local_1610;
  vector<common_arg_*,_std::allocator<common_arg_*>_> local_1608;
  vector<common_arg_*,_std::allocator<common_arg_*>_> local_15e8;
  vector<common_arg_*,_std::allocator<common_arg_*>_> local_15c8;
  common_params_context local_15a8;
  long local_1578;
  filebuf local_1570 [240];
  ios_base local_1480 [264];
  common_params local_1378;
  
  std::ofstream::ofstream(&local_1578,(string *)fname,_S_trunc|_S_out);
  common_params::common_params(&local_1378);
  common_params_parser_init(&local_15a8,&local_1378,ex,(_func_void_int_char_ptr_ptr *)0x0);
  local_15c8.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15c8.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_15c8.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_15e8.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_15e8.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_15e8.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1608.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1608.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1608.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (local_15a8.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_15a8.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    this = local_15a8.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>._M_impl.
           super__Vector_impl_data._M_start;
    do {
      if (this->is_sparam == true) {
        local_1610 = this;
        std::vector<common_arg*,std::allocator<common_arg*>>::emplace_back<common_arg*>
                  ((vector<common_arg*,std::allocator<common_arg*>> *)&local_15e8,&local_1610);
      }
      else {
        bVar1 = common_arg::in_example(this,local_15a8.ex);
        if (bVar1) {
          local_1610 = this;
          std::vector<common_arg*,std::allocator<common_arg*>>::emplace_back<common_arg*>
                    ((vector<common_arg*,std::allocator<common_arg*>> *)&local_1608,&local_1610);
        }
        else {
          local_1610 = this;
          std::vector<common_arg*,std::allocator<common_arg*>>::emplace_back<common_arg*>
                    ((vector<common_arg*,std::allocator<common_arg*>> *)&local_15c8,&local_1610);
        }
      }
      this = this + 1;
    } while (this != local_15a8.options.super__Vector_base<common_arg,_std::allocator<common_arg>_>.
                     _M_impl.super__Vector_impl_data._M_finish);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1578,"**Common params**\n\n",0x13);
  write_table((ofstream *)&local_1578,&local_15c8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1578,"\n\n**Sampling params**\n\n",0x17);
  write_table((ofstream *)&local_1578,&local_15e8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1578,"\n\n**Example-specific params**\n\n",0x1f);
  write_table((ofstream *)&local_1578,&local_1608);
  if (local_1608.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1608.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_1608.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_1608.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_15e8.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_15e8.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_15e8.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_15e8.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_15c8.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_15c8.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_15c8.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_15c8.super__Vector_base<common_arg_*,_std::allocator<common_arg_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<common_arg,_std::allocator<common_arg>_>::~vector(&local_15a8.options);
  common_params::~common_params(&local_1378);
  local_1578 = _VTT;
  *(undefined8 *)(local_1570 + *(long *)(_VTT + -0x18) + -8) = _ggml_backend_buft_name;
  std::filebuf::~filebuf(local_1570);
  std::ios_base::~ios_base(local_1480);
  return;
}

Assistant:

static void export_md(std::string fname, llama_example ex) {
    std::ofstream file(fname, std::ofstream::out | std::ofstream::trunc);

    common_params params;
    auto ctx_arg = common_params_parser_init(params, ex);

    std::vector<common_arg *> common_options;
    std::vector<common_arg *> sparam_options;
    std::vector<common_arg *> specific_options;
    for (auto & opt : ctx_arg.options) {
        // in case multiple LLAMA_EXAMPLE_* are set, we prioritize the LLAMA_EXAMPLE_* matching current example
        if (opt.is_sparam) {
            sparam_options.push_back(&opt);
        } else if (opt.in_example(ctx_arg.ex)) {
            specific_options.push_back(&opt);
        } else {
            common_options.push_back(&opt);
        }
    }

    file << "**Common params**\n\n";
    write_table(file, common_options);
    file << "\n\n**Sampling params**\n\n";
    write_table(file, sparam_options);
    file << "\n\n**Example-specific params**\n\n";
    write_table(file, specific_options);
}